

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deploymentinfo.cpp
# Opt level: O2

optional<Consensus::BuriedDeployment> GetBuriedDeployment(string_view name)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __y._M_str = "segwit";
  __y._M_len = 6;
  bVar2 = std::operator==(name,__y);
  uVar4 = 0x10000;
  uVar3 = 0x8004;
  if (!bVar2) {
    __y_00._M_str = "bip34";
    __y_00._M_len = 5;
    bVar2 = std::operator==(name,__y_00);
    uVar3 = 0x8000;
    if (!bVar2) {
      __y_01._M_str = "dersig";
      __y_01._M_len = 6;
      bVar2 = std::operator==(name,__y_01);
      uVar3 = 0x8002;
      if (!bVar2) {
        __y_02._M_str = "cltv";
        __y_02._M_len = 4;
        bVar2 = std::operator==(name,__y_02);
        uVar3 = 0x8001;
        if (!bVar2) {
          __y_03._M_str = "csv";
          __y_03._M_len = 3;
          bVar2 = std::operator==(name,__y_03);
          uVar4 = (uint)bVar2 << 0x10;
          uVar3 = 0x8003;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<Consensus::BuriedDeployment,_true,_true>)
           (_Optional_base<Consensus::BuriedDeployment,_true,_true>)(uVar4 | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Consensus::BuriedDeployment> GetBuriedDeployment(const std::string_view name)
{
    if (name == "segwit") {
        return Consensus::BuriedDeployment::DEPLOYMENT_SEGWIT;
    } else if (name == "bip34") {
        return Consensus::BuriedDeployment::DEPLOYMENT_HEIGHTINCB;
    } else if (name == "dersig") {
        return Consensus::BuriedDeployment::DEPLOYMENT_DERSIG;
    } else if (name == "cltv") {
        return Consensus::BuriedDeployment::DEPLOYMENT_CLTV;
    } else if (name == "csv") {
        return Consensus::BuriedDeployment::DEPLOYMENT_CSV;
    }
    return std::nullopt;
}